

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O3

Material * vera::extractMaterial(Model *_model,Material *_material,Scene *_scene,bool _verbose)

{
  pointer pIVar1;
  pointer *ppdVar2;
  double dVar3;
  pointer pIVar4;
  uint8_t *puVar5;
  pointer puVar6;
  size_t __n;
  bool bVar7;
  Model *pMVar8;
  int iVar9;
  int iVar10;
  iterator iVar11;
  mapped_type *ppMVar12;
  mapped_type this;
  long *plVar13;
  long lVar14;
  ostream *poVar15;
  Image *pIVar16;
  iterator iVar17;
  Texture *pTVar18;
  mapped_type *ppTVar19;
  undefined8 uVar20;
  undefined7 in_register_00000009;
  size_type *psVar21;
  pointer pdVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Alloc_hider _Var24;
  vector<double,_std::allocator<double>_> c;
  int iStack_1ac;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined4 local_17c;
  Model *local_178;
  string mat_name;
  string name;
  int local_12c;
  _Alloc_hider local_118;
  char local_108 [16];
  pointer local_f8;
  vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  local_90;
  string *local_60;
  string local_58;
  int local_34;
  
  local_17c = (undefined4)CONCAT71(in_register_00000009,_verbose);
  local_178 = _model;
  purifyString((string *)&c,&_material->name);
  toUnderscore(&name,(string *)&c);
  toLower(&mat_name,&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
           ::find(&(_scene->materials)._M_t,&mat_name);
  if ((_Rb_tree_header *)iVar11._M_node != &(_scene->materials)._M_t._M_impl.super__Rb_tree_header)
  {
    ppMVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](&_scene->materials,&mat_name);
    this = *ppMVar12;
    goto LAB_002832dd;
  }
  this = (mapped_type)operator_new(0x150);
  Material::Material(this,&mat_name);
  toUpper((string *)&c,&this->name);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&c,0,(char *)0x0,0x2e4f9e);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  psVar21 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar21) {
    name.field_2._M_allocated_capacity = *psVar21;
    name.field_2._8_4_ = (undefined4)plVar13[3];
    name.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
  }
  else {
    name.field_2._M_allocated_capacity = *psVar21;
    name._M_dataplus._M_p = (pointer)*plVar13;
  }
  name._M_string_length = plVar13[1];
  *plVar13 = (long)psVar21;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
  (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&name,local_1a8);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_BASECOLOR","");
  (*(this->super_HaveDefines)._vptr_HaveDefines[9])
            (this,&name,
             (_material->pbrMetallicRoughness).baseColorFactor.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  lVar14 = (long)(_material->pbrMetallicRoughness).baseColorTexture.index;
  if (lVar14 < 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&c,&(_material->pbrMetallicRoughness).baseColorFactor);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"diffuse","");
    local_1a8._4_4_ =
         (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_1a8._0_4_ =
         (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    uStack_1a0 = CONCAT44((float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[3],
                          (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[2]);
    Material::set(this,&name,(vec4 *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iStack_1ac = 0;
LAB_00283838:
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_EMISSIVE","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[9])
              (this,&name,
               (_material->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    lVar14 = (long)(_material->emissiveTexture).index;
    if (lVar14 < 0) {
      std::vector<double,_std::allocator<double>_>::vector(&c,&_material->emissiveFactor);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&name,"emissive","");
      local_1a8 = (undefined1  [8])
                  CONCAT44((float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[1],
                           (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start);
      uStack_1a0 = CONCAT44(uStack_1a0._4_4_,
                            (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[2]);
      Material::set(this,&name,(vec3 *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      _Var24._M_p = (pointer)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
      if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
LAB_00283c44:
        operator_delete(_Var24._M_p);
      }
    }
    else {
      pIVar4 = (local_178->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = (local_178->textures).
               super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14].source;
      pIVar1 = pIVar4 + iVar10;
      std::operator+(&name,&pIVar1->name,&pIVar4[iVar10].uri);
      if (name._M_string_length == 0) {
        local_58._M_dataplus._M_p._0_4_ = iStack_1ac;
        toString<int>((string *)local_1a8,(int *)&local_58);
        plVar13 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_1a8,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p
                                    );
        ppdVar2 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pdVar22 = (pointer)(plVar13 + 2);
        if ((pointer)*plVar13 == pdVar22) {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar22;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)ppdVar2;
        }
        else {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar22;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)*plVar13;
        }
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar13[1];
        *plVar13 = (long)pdVar22;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)&name,(string *)&c);
        if ((pointer *)
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != ppdVar2) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8);
        }
        iStack_1ac = iStack_1ac + 1;
      }
      getUniformName((string *)&c,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar16 = (Image *)operator_new(0x70);
      puVar5 = *(uint8_t **)
                &(pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      if ((pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar5) goto LAB_002847dd;
      Image::Image(pIVar16,puVar5,pIVar1->width,pIVar1->height,pIVar1->component);
      std::__cxx11::string::_M_assign((string *)&pIVar16->name);
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"emissive","");
      Material::set(this,(string *)&c,pIVar16);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((char)local_17c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"for EMISSIVEMAP as ",0x13);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,name._M_dataplus._M_p,name._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
      }
      iVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,&name);
      if ((_Rb_tree_header *)iVar17._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        pTVar18 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar18,pIVar16,LINEAR,REPEAT);
        ppTVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,&name);
        *ppTVar19 = pTVar18;
      }
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_EMISSIVEMAP","");
      (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Var24._M_p = name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) goto LAB_00283c44;
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_ROUGHNESS","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[4])
              (SUB84((_material->pbrMetallicRoughness).roughnessFactor,0),this,&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_METALLIC","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[4])
              (SUB84((_material->pbrMetallicRoughness).metallicFactor,0),this,&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    pMVar8 = local_178;
    lVar14 = (long)(_material->pbrMetallicRoughness).metallicRoughnessTexture.index;
    if (lVar14 < 0) {
LAB_002840b1:
      lVar14 = (long)(_material->occlusionTexture).index;
      if (-1 < lVar14) {
        pIVar4 = (local_178->images).
                 super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = (local_178->textures).
                 super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14].source;
        pIVar1 = pIVar4 + iVar10;
        std::operator+(&name,&pIVar1->name,&pIVar4[iVar10].uri);
        if (name._M_string_length == 0) {
          local_58._M_dataplus._M_p._0_4_ = iStack_1ac;
          toString<int>((string *)local_1a8,(int *)&local_58);
          plVar13 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_1a8,0,(char *)0x0,
                                       (ulong)mat_name._M_dataplus._M_p);
          ppdVar2 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pdVar22 = (pointer)(plVar13 + 2);
          if ((pointer)*plVar13 == pdVar22) {
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*pdVar22;
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)ppdVar2;
          }
          else {
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*pdVar22;
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)*plVar13;
          }
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar13[1];
          *plVar13 = (long)pdVar22;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)&name,(string *)&c);
          if ((pointer *)
              c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start != ppdVar2) {
            operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8);
          }
          iStack_1ac = iStack_1ac + 1;
        }
        getUniformName((string *)&c,&name);
        std::__cxx11::string::operator=((string *)&name,(string *)&c);
        if ((pointer *)
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((char)local_17c != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"for OCCLUSIONMAP as ",0x14);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,name._M_dataplus._M_p,name._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
        }
        iVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::find(&(_scene->textures)._M_t,&name);
        if ((_Rb_tree_header *)iVar17._M_node ==
            &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
          pTVar18 = (Texture *)operator_new(0x48);
          Texture::Texture(pTVar18);
          puVar6 = *(pointer *)
                    &(pIVar1->image).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
          if ((pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish == puVar6) goto LAB_00284813;
          (*pTVar18->_vptr_Texture[6])
                    (pTVar18,(ulong)(uint)pIVar1->width,(ulong)(uint)pIVar1->height,
                     (ulong)(uint)pIVar1->component,(ulong)(uint)pIVar1->bits,puVar6,0,0);
          ppTVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                     ::operator[](&_scene->textures,&name);
          *ppTVar19 = pTVar18;
        }
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_OCCLUSIONMAP","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
        if ((pointer *)
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        dVar3 = (_material->occlusionTexture).strength;
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&c,"MATERIAL_OCCLUSIONMAP_STRENGTH","");
          (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                    (SUB84((_material->occlusionTexture).strength,0),this,&c);
          if ((pointer *)
              c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage) {
            operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
    }
    else {
      tinygltf::Texture::Texture
                ((Texture *)&name,
                 (local_178->textures).
                 super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar14);
      pIVar4 = (pMVar8->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar1 = pIVar4 + local_12c;
      local_60 = &pIVar4[local_12c].uri;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                     &pIVar1->name,local_60);
      if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        local_34 = iStack_1ac;
        toString<int>(&local_58,&local_34);
        plVar13 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_58,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p
                                    );
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar23) {
          local_198._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_198._8_8_ = plVar13[3];
          local_1a8 = (undefined1  [8])&local_198;
        }
        else {
          local_198._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_1a8 = (undefined1  [8])*plVar13;
        }
        uStack_1a0 = plVar13[1];
        *plVar13 = (long)paVar23;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)&c,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p));
        }
        iStack_1ac = iStack_1ac + 1;
      }
      getUniformName((string *)local_1a8,(string *)&c);
      std::__cxx11::string::operator=((string *)&c,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8);
      }
      if ((char)local_17c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                             (long)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"for METALLICROUGHNESSMAP as ",0x1c);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,(char *)c.super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start,
                             (long)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
      }
      iVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,(key_type *)&c);
      if ((_Rb_tree_header *)iVar17._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        pTVar18 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar18);
        puVar6 = *(pointer *)
                  &(pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ;
        if ((pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish == puVar6) goto LAB_002847ef;
        (*pTVar18->_vptr_Texture[6])
                  (pTVar18,(ulong)(uint)pIVar1->width,(ulong)(uint)pIVar1->height,
                   (ulong)(uint)pIVar1->component,(ulong)(uint)pIVar1->bits,puVar6,0,0);
        ppTVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)&c);
        *ppTVar19 = pTVar18;
      }
      lVar14 = (long)(_material->occlusionTexture).index;
      if (lVar14 < 0) {
LAB_00283fe2:
        local_1a8 = (undefined1  [8])&local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"MATERIAL_ROUGHNESSMETALLICMAP","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1a8,&c);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8);
        }
        bVar7 = false;
      }
      else {
        pIVar4 = (local_178->images).
                 super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = (local_178->textures).
                 super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14].source;
        iVar9 = std::__cxx11::string::compare((char *)local_60);
        if (iVar9 == 0) goto LAB_00283fe2;
        __n = (pIVar1->uri)._M_string_length;
        if ((__n != pIVar4[iVar10].uri._M_string_length) ||
           ((__n != 0 &&
            (iVar10 = bcmp((local_60->_M_dataplus)._M_p,pIVar4[iVar10].uri._M_dataplus._M_p,__n),
            iVar10 != 0)))) goto LAB_00283fe2;
        local_1a8 = (undefined1  [8])&local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1a8,&c);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8);
        }
        dVar3 = (_material->occlusionTexture).strength;
        bVar7 = true;
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          local_1a8 = (undefined1  [8])&local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"MATERIAL_OCCLUSIONMAP_STRENGTH","");
          (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                    (SUB84((_material->occlusionTexture).strength,0),this,local_1a8);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8);
          }
        }
      }
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_c8);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&local_e0);
      if (local_f8 != (pointer)0x0) {
        operator_delete(local_f8);
      }
      if (local_118._M_p != local_108) {
        operator_delete(local_118._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      if (!bVar7) goto LAB_002840b1;
    }
    lVar14 = (long)(_material->normalTexture).index;
    if (lVar14 < 0) goto LAB_002832dd;
    pIVar4 = (local_178->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = (local_178->textures).
             super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
             super__Vector_impl_data._M_start[lVar14].source;
    pIVar1 = pIVar4 + iVar10;
    std::operator+(&name,&pIVar1->name,&pIVar4[iVar10].uri);
    if (name._M_string_length == 0) {
      local_58._M_dataplus._M_p._0_4_ = iStack_1ac;
      toString<int>((string *)local_1a8,(int *)&local_58);
      plVar13 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_1a8,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p);
      ppdVar2 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pdVar22 = (pointer)(plVar13 + 2);
      if ((pointer)*plVar13 == pdVar22) {
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*pdVar22;
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)ppdVar2;
      }
      else {
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*pdVar22;
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar13;
      }
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar13[1];
      *plVar13 = (long)pdVar22;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != ppdVar2) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8);
      }
    }
    getUniformName((string *)&c,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char)local_17c != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"for NORMALMAP as ",0x11);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,name._M_dataplus._M_p,name._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    iVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar17._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar18 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar18);
      puVar6 = *(pointer *)
                &(pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      if ((pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar6) goto LAB_00284801;
      (*pTVar18->_vptr_Texture[6])
                (pTVar18,(ulong)(uint)pIVar1->width,(ulong)(uint)pIVar1->height,
                 (ulong)(uint)pIVar1->component,(ulong)(uint)pIVar1->bits,puVar6,0,0);
      ppTVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar19 = pTVar18;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_NORMALMAP","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    dVar3 = (_material->normalTexture).scale;
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_NORMALMAP_SCALE","");
      (*(this->super_HaveDefines)._vptr_HaveDefines[6])
                ((float)(_material->normalTexture).scale,0x3f800000,this,&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
LAB_002832dd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mat_name._M_dataplus._M_p != &mat_name.field_2) {
      operator_delete(mat_name._M_dataplus._M_p);
    }
    return this;
  }
  pIVar4 = (local_178->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = (local_178->textures).
           super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
           super__Vector_impl_data._M_start[lVar14].source;
  pIVar1 = pIVar4 + iVar10;
  std::operator+(&name,&pIVar1->name,&pIVar4[iVar10].uri);
  iStack_1ac = 0;
  if (name._M_string_length == 0) {
    local_58._M_dataplus._M_p._0_4_ = 0;
    toString<int>((string *)local_1a8,(int *)&local_58);
    plVar13 = (long *)std::__cxx11::string::replace
                                ((ulong)local_1a8,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p);
    ppdVar2 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    pdVar22 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pdVar22) {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*pdVar22;
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)ppdVar2;
    }
    else {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*pdVar22;
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)*plVar13;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)plVar13[1];
    *plVar13 = (long)pdVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != ppdVar2) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8);
    }
    iStack_1ac = 1;
  }
  getUniformName((string *)&c,&name);
  std::__cxx11::string::operator=((string *)&name,(string *)&c);
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((char)local_17c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,mat_name._M_dataplus._M_p,mat_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," BASECOLORMAP as ",0x11);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,name._M_dataplus._M_p,name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  pIVar16 = (Image *)operator_new(0x70);
  puVar5 = *(uint8_t **)
            &(pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  if ((pIVar1->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    Image::Image(pIVar16,puVar5,pIVar1->width,pIVar1->height,pIVar1->component);
    std::__cxx11::string::_M_assign((string *)&pIVar16->name);
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"diffuse","");
    Material::set(this,(string *)&c,pIVar16);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar17._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar18 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar18,pIVar16,LINEAR,REPEAT);
      ppTVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar19 = pTVar18;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_BASECOLORMAP","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    goto LAB_00283838;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_002847dd:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_002847ef:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00284801:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00284813:
  uVar20 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8);
  }
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  tinygltf::Texture::~Texture((Texture *)&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mat_name._M_dataplus._M_p != &mat_name.field_2) {
    operator_delete(mat_name._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar20);
}

Assistant:

Material* extractMaterial(const tinygltf::Model& _model, const tinygltf::Material& _material, Scene* _scene, bool _verbose) {
    std::string mat_name = toLower( toUnderscore( purifyString( _material.name ) ) );

    if (_scene->materials.find(mat_name) != _scene->materials.end())
        return _scene->materials[mat_name];
        
    int texCounter = 0;
    Material* mat = new Material(mat_name);

    mat->addDefine("MATERIAL_NAME_" + toUpper(mat->name) );
    mat->addDefine("MATERIAL_BASECOLOR", (double*)_material.pbrMetallicRoughness.baseColorFactor.data(), 4);
    if (_material.pbrMetallicRoughness.baseColorTexture.index >= 0) {
        const tinygltf::Texture &tex = _model.textures[_material.pbrMetallicRoughness.baseColorTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << mat_name << " BASECOLORMAP as " << name << std::endl;

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("diffuse", img);

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);

        mat->addDefine("MATERIAL_BASECOLORMAP", name);
    } 
    else {
        std::vector<double> c = _material.pbrMetallicRoughness.baseColorFactor;
        mat->set("diffuse", glm::vec4(float(c[0]), float(c[1]), float(c[2]), float(c[3])));
    }

    mat->addDefine("MATERIAL_EMISSIVE", (double*)_material.emissiveFactor.data(), 3);
    if (_material.emissiveTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.emissiveTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("emissive", img);

        if (_verbose)
            std::cout << "Loading " << name << "for EMISSIVEMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);
        
        mat->addDefine("MATERIAL_EMISSIVEMAP", name);
    }
    else {
        std::vector<double> c = _material.emissiveFactor;
        mat->set("emissive", glm::vec3(float(c[0]), float(c[1]), float(c[2])));
    }

    bool isOcclusionRoughnessMetallic = false;
    mat->addDefine("MATERIAL_ROUGHNESS", _material.pbrMetallicRoughness.roughnessFactor);
    mat->addDefine("MATERIAL_METALLIC", _material.pbrMetallicRoughness.metallicFactor);
    if (_material.pbrMetallicRoughness.metallicRoughnessTexture.index >= 0) {
        tinygltf::Texture tex = _model.textures[_material.pbrMetallicRoughness.metallicRoughnessTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for METALLICROUGHNESSMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }

        if (_material.occlusionTexture.index >= 0) {
            const tinygltf::Image &occlussionImage = _model.images[_model.textures[_material.occlusionTexture.index].source];
            if (image.uri != "" && image.uri == occlussionImage.uri)
                isOcclusionRoughnessMetallic = true;
        }

        if (isOcclusionRoughnessMetallic) {
            mat->addDefine("MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP", name);
            if (_material.occlusionTexture.strength != 1.0)
                mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
        }
        else
            mat->addDefine("MATERIAL_ROUGHNESSMETALLICMAP", name);
    }

     // OCCLUSION
    if (!isOcclusionRoughnessMetallic && _material.occlusionTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.occlusionTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for OCCLUSIONMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_OCCLUSIONMAP", name);

        if (_material.occlusionTexture.strength != 1.0)
            mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
    }

    // NORMALMAP
    if (_material.normalTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.normalTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for NORMALMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_NORMALMAP", name);

        if (_material.normalTexture.scale != 1.0)
            mat->addDefine("MATERIAL_NORMALMAP_SCALE", glm::vec3(_material.normalTexture.scale, _material.normalTexture.scale, 1.0));
    }

    return mat;
}